

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath testing::internal::FilePath::GetCurrentDir(void)

{
  size_t extraout_RDX;
  FilePath *in_RDI;
  FilePath FVar1;
  char cwd [4097];
  FilePath *this;
  char local_1018 [4120];
  
  this = in_RDI;
  memset(local_1018,0,0x1001);
  getcwd(local_1018,0x1001);
  FilePath(this,(char *)in_RDI);
  FVar1.pathname_.length_ = extraout_RDX;
  FVar1.pathname_.c_str_ = (char *)this;
  return (FilePath)FVar1.pathname_;
}

Assistant:

FilePath FilePath::GetCurrentDir() {
#if GTEST_OS_WINDOWS_MOBILE
  // Windows CE doesn't have a current directory, so we just return
  // something reasonable.
  return FilePath(kCurrentDirectoryString);
#elif GTEST_OS_WINDOWS
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(_getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#else
  char cwd[GTEST_PATH_MAX_ + 1] = { '\0' };
  return FilePath(getcwd(cwd, sizeof(cwd)) == NULL ? "" : cwd);
#endif  // GTEST_OS_WINDOWS_MOBILE
}